

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.h
# Opt level: O0

bool __thiscall
CompareTxMemPoolEntryByScore::operator()
          (CompareTxMemPoolEntryByScore *this,CTxMemPoolEntry *a,CTxMemPoolEntry *b)

{
  long lVar1;
  long lVar2;
  int32_t iVar3;
  CAmount *pCVar4;
  Txid *other;
  long in_FS_OFFSET;
  transaction_identifier<false> *this_00;
  double dVar5;
  double dVar6;
  double f2;
  double f1;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar4 = CTxMemPoolEntry::GetFee
                     ((CTxMemPoolEntry *)
                      CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  this_00 = (transaction_identifier<false> *)(double)*pCVar4;
  iVar3 = CTxMemPoolEntry::GetTxSize
                    ((CTxMemPoolEntry *)
                     CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  dVar5 = (double)this_00 * (double)iVar3;
  pCVar4 = CTxMemPoolEntry::GetFee
                     ((CTxMemPoolEntry *)
                      CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  lVar2 = *pCVar4;
  iVar3 = CTxMemPoolEntry::GetTxSize
                    ((CTxMemPoolEntry *)
                     CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  dVar6 = (double)lVar2 * (double)iVar3;
  if ((dVar5 != dVar6) || (NAN(dVar5) || NAN(dVar6))) {
    local_9 = dVar6 < dVar5;
  }
  else {
    CTxMemPoolEntry::GetTx
              ((CTxMemPoolEntry *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    other = CTransaction::GetHash
                      ((CTransaction *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8)
                      );
    CTxMemPoolEntry::GetTx
              ((CTxMemPoolEntry *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    CTransaction::GetHash
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    local_9 = transaction_identifier<false>::operator<(this_00,other);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_9;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const CTxMemPoolEntry& a, const CTxMemPoolEntry& b) const
    {
        double f1 = (double)a.GetFee() * b.GetTxSize();
        double f2 = (double)b.GetFee() * a.GetTxSize();
        if (f1 == f2) {
            return b.GetTx().GetHash() < a.GetTx().GetHash();
        }
        return f1 > f2;
    }